

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalCreateEvent
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,
                    BOOL bInitialState,LPCWSTR lpName,HANDLE *phEvent)

{
  uint uVar1;
  size_t sVar2;
  undefined4 *puVar3;
  LPCWSTR pWStack_68;
  CObjectAttributes oa;
  IPalObject *pobjRegisteredEvent;
  ISynchStateController *pssc;
  long *local_38;
  IPalObject *pobjEvent;
  
  pWStack_68 = (LPCWSTR)0x0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName._8_8_ = lpEventAttributes;
  pssc._4_4_ = bInitialState;
  if (lpName != (LPCWSTR)0x0) {
    sVar2 = PAL_wcslen(lpName);
    oa.sObjectName.m_pwsz = (WCHAR *)CONCAT44((int)sVar2 + 1,(int)sVar2);
    pWStack_68 = lpName;
  }
  local_38 = (long *)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xdd);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (phEvent == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xde);
    fprintf(_stderr,"Expression: NULL != phEvent\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00341e73;
  if (lpName == (LPCWSTR)0x0) {
    if (bManualReset == 0) {
      puVar3 = &otAutoResetEvent;
    }
    else {
      puVar3 = &otManualResetEvent;
    }
    uVar1 = (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,puVar3,&pWStack_68,&local_38);
    if (uVar1 == 0) {
      if (pssc._4_4_ != 0) {
        uVar1 = (**(code **)(*local_38 + 0x28))(local_38,pthr,&pobjRegisteredEvent);
        if (uVar1 == 0) {
          uVar1 = (*pobjRegisteredEvent->_vptr_IPalObject[1])(pobjRegisteredEvent,1);
          (*pobjRegisteredEvent->_vptr_IPalObject[6])();
        }
        if (uVar1 != 0) {
          fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
                  ,0x10e);
          fprintf(_stderr,"Unable to set new event state (%d)\n",(ulong)uVar1);
          goto LAB_00341e37;
        }
      }
      uVar1 = (**(code **)(*g_pObjectManager + 8))
                        (g_pObjectManager,pthr,local_38,&aotEvent,0x1f0003,phEvent,
                         &oa.pSecurityAttributes);
      local_38 = (long *)0x0;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0xec);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    uVar1 = 0x32;
  }
LAB_00341e37:
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x40))(local_38,pthr);
  }
  if (oa.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)oa.pSecurityAttributes + 0x40))(oa.pSecurityAttributes,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_00341e73:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateEvent(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpEventAttributes,
    BOOL bManualReset,
    BOOL bInitialState,
    LPCWSTR lpName,
    HANDLE *phEvent
    )
{
    CObjectAttributes oa(lpName, lpEventAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    IPalObject *pobjRegisteredEvent = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phEvent);

    ENTRY("InternalCreateEvent(pthr=%p, lpEventAttributes=%p, bManualReset=%i, "
        "bInitialState=%i, lpName=%p, phEvent=%p)\n",
        pthr,
        lpEventAttributes,
        bManualReset,
        bInitialState,
        lpName,
        phEvent
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateEventExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        bManualReset ? &otManualResetEvent : &otAutoResetEvent,
        &oa,
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateEventExit;
    }

    if (bInitialState)
    {
        ISynchStateController *pssc;

        palError = pobjEvent->GetSynchStateController(
            pthr,
            &pssc
            );

        if (NO_ERROR == palError)
        {
            palError = pssc->SetSignalCount(1);
            pssc->ReleaseController();
        }

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to set new event state (%d)\n", palError);
            goto InternalCreateEventExit;
        }
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjEvent,
        &aotEvent, 
        EVENT_ALL_ACCESS, // Currently ignored (no Win32 security)
        phEvent,
        &pobjRegisteredEvent
        );

    //
    // pobjEvent is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //
    
    pobjEvent = NULL;

InternalCreateEventExit:

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredEvent)
    {
        pobjRegisteredEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateEvent returns %i\n", palError);

    return palError;
}